

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_constant_inline.cpp
# Opt level: O0

void __thiscall
mocker::GlobalConstantInline::checkFunc(GlobalConstantInline *this,FunctionModule *func)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  BasicBlockList *this_00;
  reference this_01;
  InstList *this_02;
  element_type *peVar4;
  shared_ptr<mocker::ir::Addr> *psVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  element_type *peVar8;
  int64_t iVar9;
  pair<std::__detail::_Node_iterator<std::shared_ptr<mocker::ir::Reg>,_true,_true>,_bool> pVar10;
  undefined1 local_b0 [8];
  shared_ptr<mocker::ir::IntLiteral> lit;
  bool firstTime;
  undefined1 local_80 [8];
  shared_ptr<mocker::ir::Reg> globalReg;
  undefined1 local_68 [8];
  shared_ptr<mocker::ir::Store> store;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end2;
  const_iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  const_iterator __end1;
  const_iterator __begin1;
  BasicBlockList *__range1;
  FunctionModule *func_local;
  GlobalConstantInline *this_local;
  
  this_00 = ir::FunctionModule::getBBs_abi_cxx11_(func);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(this_00);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (this_00);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&bb);
    if (!bVar2) {
      return;
    }
    this_01 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    this_02 = ir::BasicBlock::getInsts_abi_cxx11_(this_01);
    __end2 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(this_02);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(this_02);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&inst), bVar2) {
      store.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
      ir::dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)local_68,
                 (shared_ptr<mocker::ir::IRInst> *)
                 store.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_68);
        psVar5 = ir::Store::getAddr(peVar4);
        ir::dycGlobalReg((ir *)local_80,psVar5);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
        if (bVar2) {
          bVar2 = isIn<std::unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>,std::shared_ptr<mocker::ir::Reg>>
                            (&this->defined,(shared_ptr<mocker::ir::Reg> *)local_80);
          pVar10 = std::
                   unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>
                   ::emplace<std::shared_ptr<mocker::ir::Reg>&>
                             ((unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>
                               *)&this->defined,(shared_ptr<mocker::ir::Reg> *)local_80);
          lit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  pVar10.first.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>.
                  _M_cur;
          if (((~bVar2 & 1U) != 0) ||
             (bVar3 = isIn<std::unordered_map<std::shared_ptr<mocker::ir::Reg>,long,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,long>>>,std::shared_ptr<mocker::ir::Reg>>
                                (&this->constant,(shared_ptr<mocker::ir::Reg> *)local_80), bVar3)) {
            peVar4 = std::
                     __shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_68);
            psVar5 = ir::Store::getVal(peVar4);
            ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                      ((ir *)local_b0,psVar5);
            bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b0);
            if (bVar3) {
              if ((~bVar2 & 1U) == 0) {
                pmVar7 = std::
                         unordered_map<std::shared_ptr<mocker::ir::Reg>,_long,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>_>
                         ::at(&this->constant,(key_type *)local_80);
                lVar1 = *pmVar7;
                peVar8 = std::
                         __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_b0);
                iVar9 = ir::IntLiteral::getVal(peVar8);
                if (lVar1 != iVar9) {
                  iVar6 = std::
                          unordered_map<std::shared_ptr<mocker::ir::Reg>,_long,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>_>
                          ::find(&this->constant,(key_type *)local_80);
                  std::
                  unordered_map<std::shared_ptr<mocker::ir::Reg>,_long,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>_>
                  ::erase(&this->constant,iVar6);
                  globalReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_ = 5;
                  goto LAB_0020abf2;
                }
              }
              peVar8 = std::
                       __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_b0);
              iVar9 = ir::IntLiteral::getVal(peVar8);
              pmVar7 = std::
                       unordered_map<std::shared_ptr<mocker::ir::Reg>,_long,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>_>
                       ::operator[](&this->constant,(key_type *)local_80);
              *pmVar7 = iVar9;
              globalReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ = 0;
            }
            else {
              bVar2 = isIn<std::unordered_map<std::shared_ptr<mocker::ir::Reg>,long,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::ir::Reg>const,long>>>,std::shared_ptr<mocker::ir::Reg>>
                                (&this->constant,(shared_ptr<mocker::ir::Reg> *)local_80);
              if (bVar2) {
                iVar6 = std::
                        unordered_map<std::shared_ptr<mocker::ir::Reg>,_long,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>_>
                        ::find(&this->constant,(key_type *)local_80);
                std::
                unordered_map<std::shared_ptr<mocker::ir::Reg>,_long,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_long>_>_>
                ::erase(&this->constant,iVar6);
              }
              globalReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ = 5;
            }
LAB_0020abf2:
            std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
                      ((shared_ptr<mocker::ir::IntLiteral> *)local_b0);
          }
          else {
            globalReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_ = 5;
          }
        }
        else {
          globalReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ = 5;
        }
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_80);
      }
      else {
        globalReg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = 5;
      }
      std::shared_ptr<mocker::ir::Store>::~shared_ptr((shared_ptr<mocker::ir::Store> *)local_68);
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  } while( true );
}

Assistant:

void GlobalConstantInline::checkFunc(const ir::FunctionModule &func) {
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto store = ir::dyc<ir::Store>(inst);
      if (!store)
        continue;
      auto globalReg = ir::dycGlobalReg(store->getAddr());
      if (!globalReg)
        continue;

      bool firstTime = !isIn(defined, globalReg);
      defined.emplace(globalReg);
      if (!firstTime && !isIn(constant, globalReg))
        continue;

      auto lit = ir::dyc<ir::IntLiteral>(store->getVal());
      if (!lit) {
        if (isIn(constant, globalReg))
          constant.erase(constant.find(globalReg));
        continue;
      }

      if (!firstTime && constant.at(globalReg) != lit->getVal()) {
        constant.erase(constant.find(globalReg));
        continue;
      }
      constant[globalReg] = lit->getVal();
    }
  }
}